

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

size_t intersect_accel<true,false,true>(Ray *ray,Accel *accel,TraversalStats *stats)

{
  const_reference pvVar1;
  size_t sVar2;
  anon_class_8_1_a8a4b3bf local_160;
  anon_class_32_4_db591004 local_158;
  Type local_138;
  undefined1 local_134 [8];
  SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> stack;
  size_t prim_id;
  TraversalStats *stats_local;
  Accel *accel_local;
  Ray *ray_local;
  
  stack.elems[0x3f].value = 0xffffffff;
  stack.size = 0xffffffff;
  bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::SmallStack
            ((SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> *)local_134);
  pvVar1 = std::
           vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
           ::operator[]((vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                         *)accel,0);
  local_138 = (pvVar1->index).value;
  local_158.prim_id = (size_t *)(stack.elems + 0x3f);
  local_160.stats = stats;
  local_158.stats = stats;
  local_158.accel = accel;
  local_158.ray = ray;
  bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>::
  intersect<false,true,bvh::v2::SmallStack<bvh::v2::Index<32ul,4ul>,64u>,intersect_accel<true,false,true>(bvh::v2::Ray<float,3ul>&,Accel_const&,TraversalStats&)::_lambda(unsigned_long,unsigned_long)_1_,intersect_accel<true,false,true>(bvh::v2::Ray<float,3ul>&,Accel_const&,TraversalStats&)::_lambda(auto:1&&,auto:2&&)_1_>
            ((Bvh<bvh::v2::Node<float,3ul,32ul,4ul>> *)accel,ray,(Index)local_138,
             (SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> *)local_134,&local_158,&local_160);
  sVar2._0_4_ = stack.elems[0x3f].value;
  sVar2._4_4_ = stack.size;
  return sVar2;
}

Assistant:

static size_t intersect_accel(Ray& ray, const Accel& accel, TraversalStats& stats) {
    size_t prim_id = invalid_id;
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    accel.bvh.intersect<false, UseRobustTraversal>(ray, accel.bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            if constexpr (CaptureStats)
                stats.visited_leaves++;
            for (size_t i = begin; i < end; ++i) {
                size_t j = PermutePrims ? i : accel.bvh.prim_ids[i];
                if (auto hit = accel.tris[j].intersect(ray)) {
                    ray.tmax = std::get<0>(*hit);
                    prim_id = j;
                }
            }
            return prim_id != invalid_id;
        },
        [&] (auto&&, auto&&) {
            if constexpr (CaptureStats)
                stats.visited_nodes++;
        });
    return prim_id;
}